

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O0

bool __thiscall TTD::SnapShot::AllWellKnownObjectsReusable(SnapShot *this,InflateMap *inflator)

{
  bool bVar1;
  SnapObject *snpObject;
  RecyclableObject *obj;
  DynamicObject *dynObj;
  bool blocking;
  RecyclableObject *rObj;
  SnapObject *snpObj;
  Iterator iter;
  InflateMap *inflator_local;
  SnapShot *this_local;
  
  iter.m_currEntry = (SnapObject *)inflator;
  UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::GetIterator
            ((Iterator *)&snpObj,&this->m_compoundObjectList);
  do {
    bVar1 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::IsValid
                      ((Iterator *)&snpObj);
    if (!bVar1) {
      return true;
    }
    snpObject = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::Current
                          ((Iterator *)&snpObj);
    if (snpObject->OptWellKnownToken != (TTD_WELLKNOWN_TOKEN)0x0) {
      obj = InflateMap::FindReusableObject_WellKnowReuseCheck
                      ((InflateMap *)iter.m_currEntry,snpObject->ObjectPtrId);
      dynObj = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
      bVar1 = NSSnapObjects::DoesObjectBlockScriptContextReuse
                        (snpObject,dynObj,(InflateMap *)iter.m_currEntry);
      if (bVar1) {
        return false;
      }
    }
    UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::MoveNext
              ((Iterator *)&snpObj);
  } while( true );
}

Assistant:

bool SnapShot::AllWellKnownObjectsReusable(InflateMap* inflator) const
    {
        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapObjects::SnapObject* snpObj = iter.Current();
            if(snpObj->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN)
            {
                Js::RecyclableObject* rObj = inflator->FindReusableObject_WellKnowReuseCheck(snpObj->ObjectPtrId);
                bool blocking = NSSnapObjects::DoesObjectBlockScriptContextReuse(snpObj, Js::VarTo<Js::DynamicObject>(rObj), inflator);

                if(blocking)
                {
                    return false;
                }
            }
        }

        return true;
    }